

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

int __thiscall
JsUtil::
List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>::
Add(List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
    *this,Utf8SourceInfo **item)

{
  int iVar1;
  Utf8SourceInfo *ptr;
  WriteBarrierPtr<Js::Utf8SourceInfo> **ppWVar2;
  int pos;
  Utf8SourceInfo **item_local;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *this_local;
  
  EnsureArray(this);
  ptr = *item;
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)
                       &(this->
                        super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>
                        ).buffer);
  Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator=
            (*ppWVar2 +
             (this->
             super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
             count,ptr);
  iVar1 = (this->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>
          ).count;
  (this->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).count
       = (this->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>)
         .count + 1;
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            EnsureArray();
            this->buffer[this->count] = item;
            int pos = this->count;
            this->count++;
            return pos;
        }